

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_SetupBackwardInit(Abc_Ntk_t *pNtk)

{
  MinRegMan_t *pMVar1;
  int iVar2;
  Vec_Ptr_t *vFanins;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *Entry;
  int i;
  Abc_NtkFunc_t Func;
  Abc_NtkType_t Type;
  
  vFanins = Vec_PtrAlloc(100);
  Type = pNtk->ntkType;
  if (Type == ABC_NTK_STRASH) {
    Type = ABC_NTK_LOGIC;
  }
  else {
    Func = pNtk->ntkFunc;
    if (Func != ABC_FUNC_MAP) goto LAB_0040d12b;
  }
  Func = ABC_FUNC_SOP;
LAB_0040d12b:
  pAVar3 = Abc_NtkAlloc(Type,Func,1);
  pManMR->pInitNtk = pAVar3;
  i = 0;
  do {
    pMVar1 = pManMR;
    if (pNtk->vBoxes->nSize <= i) {
      if (vFanins->nSize == 0) {
        pManMR->fSolutionIsDc = 1;
        return;
      }
      pManMR->fSolutionIsDc = 0;
      pAVar4 = Abc_NtkCreateNodeAnd(pMVar1->pInitNtk,vFanins);
      pAVar5 = Abc_NtkCreatePo(pManMR->pInitNtk);
      Abc_ObjAddFanin(pAVar5,pAVar4);
      Vec_PtrFree(vFanins);
      return;
    }
    pAVar4 = Abc_NtkBox(pNtk,i);
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
      pAVar5 = Abc_NtkCreatePi(pManMR->pInitNtk);
      iVar2 = Abc_LatchIsInit0(pAVar4);
      if (iVar2 == 0) {
        iVar2 = Abc_LatchIsInit1(pAVar4);
        Entry = pAVar5;
        if (iVar2 != 0) goto LAB_0040d1ab;
      }
      else {
        Entry = Abc_NtkCreateNodeInv(pManMR->pInitNtk,pAVar5);
LAB_0040d1ab:
        Vec_PtrPush(vFanins,Entry);
      }
      (pAVar4->field_5).pData = pAVar5;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_FlowRetime_SetupBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pLatch, *pObj, *pPi;
  int i;
  Vec_Ptr_t *vObj = Vec_PtrAlloc(100);

  // create the network used for the initial state computation
  if (Abc_NtkIsStrash(pNtk)) {
    pManMR->pInitNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
  } else if (Abc_NtkHasMapping(pNtk))
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, ABC_FUNC_SOP, 1 );
  else
    pManMR->pInitNtk = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );

  // mitre inputs
  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    // map latch to initial state network
    pPi = Abc_NtkCreatePi( pManMR->pInitNtk );

    // DEBUG
    // printf("setup : mapping latch %d to PI %d\n", pLatch->Id, pPi->Id);

    // has initial state requirement?
    if (Abc_LatchIsInit0(pLatch)) {
      pObj = Abc_NtkCreateNodeInv( pManMR->pInitNtk, pPi );
      Vec_PtrPush(vObj, pObj);
    }
    else if (Abc_LatchIsInit1(pLatch)) {
      Vec_PtrPush(vObj, pPi);
    }
    
    Abc_ObjSetData( pLatch, pPi );     // if not verifying init state
    // FDATA(pLatch)->pInitObj = pPi;  // if verifying init state
  }

  // are there any nodes not DC?
  if (!Vec_PtrSize(vObj)) {
    pManMR->fSolutionIsDc = 1;
    return;
  } else 
    pManMR->fSolutionIsDc = 0;

  // mitre output

  // create n-input AND gate
  pObj = Abc_NtkCreateNodeAnd( pManMR->pInitNtk, vObj );

  Abc_ObjAddFanin( Abc_NtkCreatePo( pManMR->pInitNtk ), pObj );

  Vec_PtrFree( vObj );
}